

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall geemuboi::test::core::CpuTest_ld_mhl_a_Test::TestBody(CpuTest_ld_mhl_a_Test *this)

{
  bool bVar1;
  uint16_t value;
  MockSpec<void_(unsigned_short,_unsigned_char)> *this_00;
  pointer pIVar2;
  char *message;
  AssertHelper local_c0;
  Message local_b8;
  int local_b0;
  uint local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  Registers expected_regs;
  Matcher<unsigned_char> local_78;
  Matcher<unsigned_short> local_60;
  MockSpec<void_(unsigned_short,_unsigned_char)> local_48;
  CpuTest_ld_mhl_a_Test *local_10;
  CpuTest_ld_mhl_a_Test *this_local;
  
  (this->super_CpuTest).regs.f = 0xf0;
  (this->super_CpuTest).regs.a = 0xfe;
  (this->super_CpuTest).regs.h = '3';
  (this->super_CpuTest).regs.l = 'D';
  local_10 = this;
  value = CpuTest::make_addr(&this->super_CpuTest,(this->super_CpuTest).regs.h,
                             (this->super_CpuTest).regs.l);
  testing::Matcher<unsigned_short>::Matcher(&local_60,value);
  testing::Matcher<unsigned_char>::Matcher(&local_78,(this->super_CpuTest).regs.a);
  MockMmu::gmock_write_byte(&local_48,&(this->super_CpuTest).mmu,&local_60,&local_78);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::operator()
                      (&local_48,(WithoutMatchers *)((long)&expected_regs.sp + 1),(void *)0x0);
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
             ,0x78c,"mmu","write_byte(make_addr(regs.h, regs.l), regs.a)");
  testing::internal::MockSpec<void_(unsigned_short,_unsigned_char)>::~MockSpec(&local_48);
  testing::Matcher<unsigned_char>::~Matcher(&local_78);
  testing::Matcher<unsigned_short>::~Matcher(&local_60);
  CpuTest::execute_instruction(&this->super_CpuTest,'w');
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf0443300000000fe;
  expected_regs.a = '\x01';
  expected_regs.b = '\0';
  expected_regs.c = '\0';
  expected_regs.d = '\0';
  CpuTest::verify_state_changes(&this->super_CpuTest,(Registers *)&gtest_ar.message_);
  pIVar2 = std::unique_ptr<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>::
           operator->(&(this->super_CpuTest).cpu);
  local_ac = (*pIVar2->_vptr_ICpu[1])();
  local_b0 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_a8,"cpu->get_cycles_executed()","2",&local_ac,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x797,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  return;
}

Assistant:

TEST_F(CpuTest, ld_mhl_a) {
    regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;

    regs.a = 0xFE;
    regs.h = 0x33;
    regs.l = 0x44;

    EXPECT_CALL(mmu, write_byte(make_addr(regs.h, regs.l), regs.a));
    execute_instruction(0x77);

    ICpu::Registers expected_regs{};
    expected_regs.a = 0xFE;
    expected_regs.h = 0x33;
    expected_regs.l = 0x44;
    expected_regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}